

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_const_value.h
# Opt level: O3

string * __thiscall
t_const_value::get_identifier_name_abi_cxx11_(string *__return_storage_ptr__,t_const_value *this)

{
  pointer pcVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->identifierVal_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (this->identifierVal_)._M_string_length);
  lVar2 = std::__cxx11::string::find((char)__return_storage_ptr__,0x2e);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)&local_48,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    lVar2 = std::__cxx11::string::find((char)__return_storage_ptr__,0x2e);
    if (lVar2 != -1) {
      std::__cxx11::string::substr((ulong)&local_48,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
    }
    return __return_storage_ptr__;
  }
  __return_storage_ptr___00 =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       __cxa_allocate_exception(0x20);
  std::operator+(&local_48,"error: identifier ",__return_storage_ptr__);
  std::operator+(__return_storage_ptr___00,&local_48," is unqualified!");
  __cxa_throw(__return_storage_ptr___00,&std::__cxx11::string::typeinfo,
              std::__cxx11::string::~string);
}

Assistant:

std::string get_identifier_name() const {
    std::string ret = get_identifier();
    size_t s = ret.find('.');
    if (s == std::string::npos) {
      throw "error: identifier " + ret + " is unqualified!";
    }
    ret = ret.substr(s + 1);
    s = ret.find('.');
    if (s != std::string::npos) {
      ret = ret.substr(s + 1);
    }
    return ret;
  }